

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
Chainstate::ResizeCoinsCaches(Chainstate *this,size_t coinstip_size,size_t coinsdb_size)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  long in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char *pcVar2;
  undefined1 auVar3 [16];
  Level in_stack_00000030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000040;
  double *in_stack_00000048;
  bool ret;
  size_t old_coinstip_size;
  BlockValidationState state;
  FlushStateMode in_stack_0000015c;
  BlockValidationState *in_stack_00000160;
  Chainstate *in_stack_00000168;
  int in_stack_00000254;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 uVar4;
  int in_stack_fffffffffffffe8c;
  CCoinsViewDB *in_stack_fffffffffffffe90;
  Chainstate *in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  char *flag;
  ulong uVar5;
  bool local_e1;
  ConstevalFormatString<2U> in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff40;
  string_view in_stack_ffffffffffffff50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe8c,(AnnotatedMixin<std::recursive_mutex> *)0x7ec39d);
  if ((in_RSI == *(ulong *)(in_RDI + 0xd0)) && (in_RDX == *(long *)(in_RDI + 200))) {
    local_e1 = true;
  }
  else {
    uVar5 = *(ulong *)(in_RDI + 0xd0);
    *(ulong *)(in_RDI + 0xd0) = in_RSI;
    *(long *)(in_RDI + 200) = in_RDX;
    CoinsDB(in_stack_fffffffffffffe98);
    CCoinsViewDB::ResizeCache
              (in_stack_fffffffffffffe90,
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    flag = "[%s] resized coinsdb cache to %.1f MiB\n";
    ToString_abi_cxx11_((Chainstate *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0))
    ;
    auVar3._8_4_ = (int)((ulong)in_RDX >> 0x20);
    auVar3._0_8_ = in_RDX;
    auVar3._12_4_ = 0x45300000;
    pcVar2 = (char *)(((auVar3._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0)) *
                     9.5367431640625e-07);
    __str = &stack0xffffffffffffff48;
    uVar4 = 2;
    source_file._M_str = pcVar2;
    source_file._M_len = in_stack_ffffffffffffff40;
    LogPrintFormatInternal<std::__cxx11::string,double>
              (in_stack_ffffffffffffff50,source_file,(int)(uVar5 >> 0x20),(LogFlags)flag,
               in_stack_00000030,in_stack_ffffffffffffff38,in_stack_00000040,in_stack_00000048);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,uVar4));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffea8,__str);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffea8,__str);
    ToString_abi_cxx11_((Chainstate *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0))
    ;
    uVar4 = 2;
    source_file_00._M_str = pcVar2;
    source_file_00._M_len = in_stack_ffffffffffffff40;
    LogPrintFormatInternal<std::__cxx11::string,double>
              (in_stack_ffffffffffffff50,source_file_00,(int)(uVar5 >> 0x20),(LogFlags)flag,
               in_stack_00000030,in_stack_ffffffffffffff38,in_stack_00000040,in_stack_00000048);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe8c,uVar4));
    BlockValidationState::BlockValidationState
              ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffe8c,uVar4));
    if (uVar5 < in_RSI) {
      local_e1 = FlushStateToDisk(in_stack_00000168,in_stack_00000160,in_stack_0000015c,
                                  in_stack_00000254);
    }
    else {
      local_e1 = FlushStateToDisk(in_stack_00000168,in_stack_00000160,in_stack_0000015c,
                                  in_stack_00000254);
    }
    BlockValidationState::~BlockValidationState
              ((BlockValidationState *)CONCAT44(in_stack_fffffffffffffe8c,uVar4));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_e1;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::ResizeCoinsCaches(size_t coinstip_size, size_t coinsdb_size)
{
    AssertLockHeld(::cs_main);
    if (coinstip_size == m_coinstip_cache_size_bytes &&
            coinsdb_size == m_coinsdb_cache_size_bytes) {
        // Cache sizes are unchanged, no need to continue.
        return true;
    }
    size_t old_coinstip_size = m_coinstip_cache_size_bytes;
    m_coinstip_cache_size_bytes = coinstip_size;
    m_coinsdb_cache_size_bytes = coinsdb_size;
    CoinsDB().ResizeCache(coinsdb_size);

    LogPrintf("[%s] resized coinsdb cache to %.1f MiB\n",
        this->ToString(), coinsdb_size * (1.0 / 1024 / 1024));
    LogPrintf("[%s] resized coinstip cache to %.1f MiB\n",
        this->ToString(), coinstip_size * (1.0 / 1024 / 1024));

    BlockValidationState state;
    bool ret;

    if (coinstip_size > old_coinstip_size) {
        // Likely no need to flush if cache sizes have grown.
        ret = FlushStateToDisk(state, FlushStateMode::IF_NEEDED);
    } else {
        // Otherwise, flush state to disk and deallocate the in-memory coins map.
        ret = FlushStateToDisk(state, FlushStateMode::ALWAYS);
    }
    return ret;
}